

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer-CH.cc
# Opt level: O3

void normalize_digital_lower(string *line)

{
  byte bVar1;
  pointer pcVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  
  if (line->_M_string_length != 0) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      pcVar2 = (line->_M_dataplus)._M_p;
      bVar1 = pcVar2[uVar4];
      if ('/' < (char)bVar1) {
        bVar5 = 0x30;
        if (0x39 < bVar1) {
          if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_001624d5;
          bVar5 = bVar1 | 0x20;
        }
        pcVar2[uVar4] = bVar5;
      }
LAB_001624d5:
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < line->_M_string_length);
  }
  return;
}

Assistant:

void normalize_digital_lower(string& line){
  for(unsigned i = 0; i < line.size(); i ++){
    if(line[i] >= '0' && line[i] <= '9'){
      line[i] = '0';
    }
    else if(line[i] >= 'A' && line[i] <= 'Z'){
      line[i] = line[i] - 'A' + 'a';
    }
  }
}